

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O1

void __thiscall transwarp::detail::thread_pool::thread_pool(thread_pool *this,size_t n_threads)

{
  ulong uVar1;
  invalid_parameter *this_00;
  ulong uVar2;
  thread thread;
  thread local_80;
  vector<std::thread,_std::allocator<std::thread>_> *local_78;
  condition_variable *local_70;
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  *local_68;
  thread_pool *local_60;
  thread local_58;
  string local_50;
  
  this->done_ = false;
  local_78 = &this->threads_;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->functors_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->functors_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->functors_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->functors_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->functors_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->functors_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->functors_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->functors_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->functors_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->functors_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_initialize_map((_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *
                    )&this->functors_,0);
  local_70 = &this->cond_var_;
  local_68 = &this->functors_;
  std::condition_variable::condition_variable(local_70);
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  if (n_threads == 0) {
    this_00 = (invalid_parameter *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"number of threads","");
    invalid_parameter::invalid_parameter(this_00,&local_50);
    __cxa_throw(this_00,&invalid_parameter::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = (long)(this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  uVar2 = n_threads + uVar1;
  if (uVar1 < uVar2) {
    do {
      local_80._M_id._M_thread = (id)0;
      local_50._M_dataplus._M_p = (pointer)worker;
      local_50._M_string_length = 0;
      local_60 = this;
      std::thread::
      thread<void(transwarp::detail::thread_pool::*)(),transwarp::detail::thread_pool*,void>
                (&local_58,(offset_in_thread_pool_to_subr *)&local_50,&local_60);
      if (local_80._M_id._M_thread != 0) {
LAB_0018930b:
        std::terminate();
      }
      local_80._M_id._M_thread = local_58._M_id._M_thread;
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (local_78,&local_80);
      if (local_80._M_id._M_thread != 0) goto LAB_0018930b;
    } while ((ulong)((long)(this->threads_).
                           super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->threads_).
                           super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) < uVar2);
  }
  return;
}

Assistant:

explicit thread_pool(std::size_t n_threads)
    : done_(false)
    {
        if (n_threads == 0) {
            throw transwarp::invalid_parameter("number of threads");
        }
        const std::size_t n_target = threads_.size() + n_threads;
        while (threads_.size() < n_target) {
            std::thread thread;
            try {
                thread = std::thread(&thread_pool::worker, this);
            } catch (...) {
                shutdown();
                throw;
            }
            try {
                threads_.push_back(std::move(thread));
            } catch (...) {
                shutdown();
                thread.join();
                throw;
            }
        }
    }